

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::BrReg1(ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R1_00;
  undefined4 *puVar3;
  FunctionBody *this_00;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x15);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x330,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0088ebf5;
    *puVar3 = 0;
  }
  CheckLabel(this,labelID);
  if (R1 != 0xffffffff) {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0088ebf5;
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
    }
    R1_00 = FunctionBody::MapRegSlot(this_00,R1);
    bVar2 = TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,labelID,R1_00);
    if (!bVar2) {
      bVar2 = TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,labelID,R1_00);
      if (!bVar2) {
        bVar2 = TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op,labelID,R1_00);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x335,"(success)","success");
          if (!bVar2) goto LAB_0088ebf5;
          *puVar3 = 0;
        }
      }
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0088ebf5:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::BrReg1(OpCode op, ByteCodeLabel labelID, RegSlot R1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrReg1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(BrReg1, op, labelID, R1);
    }